

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O0

archive * cppcms::operator&(archive *a,unique_ptr<int,_std::default_delete<int>_> *object)

{
  int iVar1;
  pointer *in_RSI;
  archive *in_RDI;
  pointer *unaff_retaddr;
  archive *in_stack_ffffffffffffffe8;
  
  iVar1 = cppcms::archive::mode();
  if (iVar1 == 0) {
    archive_traits<std::unique_ptr<int,_std::default_delete<int>_>,_void>::save
              (in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    archive_traits<std::unique_ptr<int,_std::default_delete<int>_>,_void>::load
              (unaff_retaddr,in_RDI);
  }
  return in_RDI;
}

Assistant:

archive & operator &(archive &a,Archivable &object)
	{
		if(a.mode() == archive::save_to_archive)
			archive_traits<Archivable>::save(object,a);
		else
			archive_traits<Archivable>::load(object,a);
		return a;
	}